

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

EntryType * __thiscall
JsUtil::
BaseDictionary<unsigned_long,_const_TTD::NSSnapObjects::SnapObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::AllocateEntries(BaseDictionary<unsigned_long,_const_TTD::NSSnapObjects::SnapObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *this,int size,bool zeroAllocate)

{
  undefined1 auVar1 [16];
  bool bVar2;
  BOOL BVar3;
  HeapAllocator *pHVar4;
  undefined4 *puVar5;
  code *pcVar6;
  EntryType *pEVar7;
  undefined8 uVar8;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  local_50 = (undefined1  [8])
             &SimpleDictionaryEntry<unsigned_long,TTD::NSSnapObjects::SnapObject_const*>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_1369e8;
  data.filename._0_4_ = 0x453;
  data.plusSize = (long)size;
  pHVar4 = Memory::HeapAllocator::TrackAllocInfo(this->alloc,(TrackAllocData *)local_50);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)size;
  uVar8 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
    uVar8 = SUB168(auVar1 * ZEXT816(0x18),0);
  }
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00924580;
    *puVar5 = 0;
  }
  if (zeroAllocate) {
    pcVar6 = Memory::HeapAllocator::AllocZero;
  }
  else {
    pcVar6 = Memory::HeapAllocator::Alloc;
  }
  pEVar7 = (EntryType *)(*pcVar6)(pHVar4,uVar8);
  if (pEVar7 == (EntryType *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00924580:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar5 = 0;
  }
  return pEVar7;
}

Assistant:

EntryType * AllocateEntries(DECLSPEC_GUARD_OVERFLOW int size, const bool zeroAllocate = true)
        {
            // Note that the choice of leaf/non-leaf node is decided for the EntryType on the basis of TValue. By default, if
            // TValue is a pointer, a non-leaf allocation is done. This behavior can be overridden by specializing
            // TypeAllocatorFunc for TValue.
            return
                AllocateArray<AllocatorType, EntryType, false>(
                    TRACK_ALLOC_INFO(alloc, EntryType, AllocatorType, 0, size),
                    zeroAllocate ? EntryAllocatorFuncType::GetAllocZeroFunc() : EntryAllocatorFuncType::GetAllocFunc(),
                    size);
        }